

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionAlgorithmsBullet.cpp
# Opt level: O2

void __thiscall
chrono::collision::cbtSphereCylinderCollisionAlgorithm::processCollision
          (cbtSphereCylinderCollisionAlgorithm *this,cbtCollisionObjectWrapper *body0,
          cbtCollisionObjectWrapper *body1,cbtDispatcherInfo *dispatchInfo,
          cbtManifoldResult *resultOut)

{
  bool bVar1;
  cbtCollisionShape *this_00;
  cbtCollisionShape *pcVar2;
  float fVar3;
  uint uVar4;
  cbtCollisionObjectWrapper *pcVar5;
  cbtTransform *this_01;
  undefined1 auVar6 [16];
  cbtScalar cVar7;
  float fVar8;
  undefined1 auVar10 [16];
  undefined8 uVar22;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  ulong uVar9;
  ulong in_XMM0_Qb;
  undefined1 auVar23 [56];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined8 in_XMM1_Qb;
  undefined1 auVar31 [56];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  float fVar32;
  cbtVector3 cVar33;
  cbtScalar r1_len;
  cbtVector3 normalOnSurfaceB;
  cbtVector3 r1;
  cbtVector3 pos1;
  cbtVector3 pos_loc;
  cbtVector3 d;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  undefined1 local_b8 [16];
  cbtScalar local_9c;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  cbtVector3 local_68;
  cbtVector3 local_58;
  cbtVector3 local_48;
  cbtVector3 local_38;
  
  if (this->m_manifoldPtr == (cbtPersistentManifold *)0x0) {
    return;
  }
  bVar1 = this->m_isSwapped;
  resultOut->m_manifoldPtr = this->m_manifoldPtr;
  pcVar5 = body1;
  if (bVar1 != false) {
    pcVar5 = body0;
    body0 = body1;
  }
  this_00 = pcVar5->m_shape;
  pcVar2 = body0->m_shape;
  this_01 = &pcVar5->m_collisionObject->m_worldTransform;
  cVar33 = cbtTransform::invXform(this_01,&(body0->m_collisionObject->m_worldTransform).m_origin);
  local_b8._8_8_ = in_XMM0_Qb;
  local_b8._0_8_ = cVar33.m_floats._0_8_;
  local_98._8_8_ = in_XMM1_Qb;
  local_98._0_8_ = cVar33.m_floats._8_8_;
  fVar3 = *(float *)&pcVar2[1].field_0xc * *(float *)&pcVar2->field_0x1c;
  auVar23 = (undefined1  [56])0x0;
  cVar33 = cbtCylinderShape::getHalfExtentsWithMargin((cbtCylinderShape *)this_00);
  auVar13._0_8_ = cVar33.m_floats._0_8_;
  auVar13._8_56_ = auVar23;
  local_88 = auVar13._0_16_;
  cVar33 = cbtCylinderShape::getHalfExtentsWithMargin((cbtCylinderShape *)this_00);
  auVar14._0_8_ = cVar33.m_floats._0_8_;
  auVar14._8_56_ = auVar23;
  auVar6 = vmovshdup_avx(auVar14._0_16_);
  auVar23 = ZEXT856(in_XMM0_Qb);
  auVar12 = vunpcklpd_avx(local_b8,local_98);
  local_68.m_floats._8_8_ = auVar12._8_8_;
  local_68.m_floats[0] = auVar12._0_4_;
  local_68.m_floats[1] = 0.0;
  auVar12 = vmovshdup_avx(local_b8);
  cVar7 = cbtVector3::length(&local_68);
  fVar8 = auVar6._0_4_;
  fVar32 = auVar12._0_4_;
  auVar10._8_4_ = 0x80000000;
  auVar10._0_8_ = 0x8000000080000000;
  auVar10._12_4_ = 0x80000000;
  auVar6 = vxorps_avx512vl(auVar6,auVar10);
  auVar10 = SUB6416(ZEXT464(0x3f800000),0);
  local_9c = cVar7;
  local_78 = auVar10;
  if ((fVar8 < fVar32) || (fVar32 < auVar6._0_4_)) {
    uVar22 = vcmpss_avx512f(auVar12,auVar6,1);
    bVar1 = (bool)((byte)uVar22 & 1);
    auVar31 = ZEXT856((ulong)local_88._8_8_);
    uVar4 = (uint)bVar1 * -0x40800000 + (uint)!bVar1 * 0x3f800000;
    local_98 = ZEXT416(uVar4);
    if (cVar7 <= (float)local_88._0_4_) {
      local_58.m_floats = (cbtScalar  [4])(ZEXT416(uVar4) << 0x20);
      cVar33 = ::operator*(&this_01->m_basis,&local_58);
      auVar29._0_8_ = cVar33.m_floats._8_8_;
      auVar29._8_56_ = auVar23;
      auVar20._0_8_ = cVar33.m_floats._0_8_;
      auVar20._8_56_ = auVar31;
      local_78 = vmovlhps_avx(auVar20._0_16_,auVar29._0_16_);
      auVar6 = vunpcklps_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(fVar8 * (float)local_98._0_4_)));
      auVar12._0_4_ = auVar6._0_4_ + local_68.m_floats[0];
      auVar12._4_4_ = auVar6._4_4_ + local_68.m_floats[1];
      auVar12._8_4_ = auVar6._8_4_ + 0.0;
      auVar12._12_4_ = auVar6._12_4_ + 0.0;
      auVar31 = (undefined1  [56])0x0;
      local_48.m_floats =
           (cbtScalar  [4])vinsertps_avx(auVar12,ZEXT416((uint)(local_68.m_floats[2] + 0.0)),0x28);
      auVar23 = ZEXT856(local_48.m_floats._8_8_);
      cVar33 = cbtTransform::operator()(this_01,&local_48);
      auVar30._0_8_ = cVar33.m_floats._8_8_;
      auVar30._8_56_ = auVar31;
      auVar21._0_8_ = cVar33.m_floats._0_8_;
      auVar21._8_56_ = auVar23;
      local_58.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar21._0_16_,auVar30._0_16_);
      auVar6 = vfmsub213ss_fma(ZEXT416((uint)(fVar32 - fVar8)),local_98,ZEXT416((uint)fVar3));
      uVar9 = auVar6._0_8_;
    }
    else {
      uVar9 = local_88._8_8_;
      cVar33 = cbtVector3::normalized(&local_68);
      auVar6 = vunpcklps_avx(ZEXT416(0) << 0x20,ZEXT416((uint)((float)local_98._0_4_ * fVar8)));
      auVar11._0_4_ = (float)local_88._0_4_ * cVar33.m_floats[0] + auVar6._0_4_;
      auVar11._4_4_ = (float)local_88._0_4_ * cVar33.m_floats[1] + auVar6._4_4_;
      auVar11._8_4_ = (float)local_88._0_4_ * (float)uVar9 + auVar6._8_4_;
      auVar11._12_4_ = (float)local_88._0_4_ * (float)(uVar9 >> 0x20) + auVar6._12_4_;
      auVar31 = (undefined1  [56])0x0;
      local_48.m_floats =
           (cbtScalar  [4])
           vinsertps_avx(auVar11,ZEXT416((uint)((float)local_88._0_4_ * cVar33.m_floats[2] + 0.0)),
                         0x28);
      auVar23 = ZEXT856(local_48.m_floats._8_8_);
      cVar33 = cbtTransform::operator()(this_01,&local_48);
      auVar26._0_8_ = cVar33.m_floats._8_8_;
      auVar26._8_56_ = auVar31;
      auVar17._0_8_ = cVar33.m_floats._0_8_;
      auVar17._8_56_ = auVar23;
      local_58.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar17._0_16_,auVar26._0_16_);
      auVar23 = ZEXT856(local_58.m_floats._8_8_);
      cVar33 = ::operator-(&(body0->m_collisionObject->m_worldTransform).m_origin,&local_58);
      auVar27._0_8_ = cVar33.m_floats._8_8_;
      auVar27._8_56_ = auVar31;
      auVar18._0_8_ = cVar33.m_floats._0_8_;
      auVar18._8_56_ = auVar23;
      local_38.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar18._0_16_,auVar27._0_16_);
      auVar23 = ZEXT856(local_38.m_floats._8_8_);
      cVar33 = cbtVector3::normalized(&local_38);
      auVar28._0_8_ = cVar33.m_floats._8_8_;
      auVar28._8_56_ = auVar31;
      auVar19._0_8_ = cVar33.m_floats._0_8_;
      auVar19._8_56_ = auVar23;
      local_78 = vmovlhps_avx(auVar19._0_16_,auVar28._0_16_);
      cVar7 = cbtVector3::length(&local_38);
      uVar9 = (ulong)(uint)(cVar7 - fVar3);
    }
  }
  else {
    fVar3 = (float)local_88._0_4_ + fVar3;
    auVar23 = (undefined1  [56])0x0;
    if (fVar3 < cVar7) goto LAB_00d3f313;
    auVar6 = ZEXT816(0) << 0x40;
    auVar31 = ZEXT856(0);
    if (1.1920929e-07 < cVar7) {
      cVar33 = ::operator/(&local_68,&local_9c);
      auVar24._0_8_ = cVar33.m_floats._8_8_;
      auVar24._8_56_ = auVar31;
      auVar15._0_8_ = cVar33.m_floats._0_8_;
      auVar15._8_56_ = auVar23;
      local_48.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar15._0_16_,auVar24._0_16_);
      auVar23 = ZEXT856(local_48.m_floats._8_8_);
      cVar33 = ::operator*(&this_01->m_basis,&local_48);
      auVar25._0_8_ = cVar33.m_floats._8_8_;
      auVar25._8_56_ = auVar31;
      auVar16._0_8_ = cVar33.m_floats._0_8_;
      auVar16._8_56_ = auVar23;
      auVar10 = auVar16._0_16_;
      auVar6 = auVar25._0_16_;
      local_78 = vmovlhps_avx(auVar10,auVar6);
    }
    uVar22 = 0;
    local_38.m_floats = (cbtScalar  [4])(ZEXT416((uint)fVar32) << 0x20);
    cVar33 = cbtTransform::operator()(this_01,&local_38);
    local_c8 = auVar10._0_4_;
    fStack_c4 = auVar10._4_4_;
    fStack_c0 = auVar10._8_4_;
    fStack_bc = auVar10._12_4_;
    local_b8._0_4_ = auVar6._0_4_;
    auVar6._0_4_ = cVar33.m_floats[0] + (float)local_88._0_4_ * local_c8;
    auVar6._4_4_ = cVar33.m_floats[1] + (float)local_88._0_4_ * fStack_c4;
    auVar6._8_4_ = (float)uVar22 + (float)local_88._0_4_ * fStack_c0;
    auVar6._12_4_ = (float)((ulong)uVar22 >> 0x20) + (float)local_88._0_4_ * fStack_bc;
    local_58.m_floats =
         (cbtScalar  [4])
         vinsertps_avx(auVar6,ZEXT416((uint)(cVar33.m_floats[2] +
                                            (float)local_88._0_4_ * (float)local_b8._0_4_)),0x28);
    uVar9 = (ulong)(uint)(cVar7 - fVar3);
  }
  (*(resultOut->super_Result)._vptr_Result[4])(uVar9,resultOut,local_78,&local_58);
LAB_00d3f313:
  cbtManifoldResult::refreshContactPoints(resultOut);
  return;
}

Assistant:

void cbtSphereCylinderCollisionAlgorithm::processCollision(const cbtCollisionObjectWrapper* body0,
                                                           const cbtCollisionObjectWrapper* body1,
                                                           const cbtDispatcherInfo& dispatchInfo,
                                                           cbtManifoldResult* resultOut) {
    (void)dispatchInfo;
    (void)resultOut;
    if (!m_manifoldPtr)
        return;

    const cbtCollisionObjectWrapper* sphereObjWrap = m_isSwapped ? body1 : body0;
    const cbtCollisionObjectWrapper* cylObjWrap = m_isSwapped ? body0 : body1;

    resultOut->setPersistentManifold(m_manifoldPtr);

    const cbtSphereShape* sphere0 = (cbtSphereShape*)sphereObjWrap->getCollisionShape();
    const cbtCylinderShape* cylinder = (cbtCylinderShape*)cylObjWrap->getCollisionShape();

    const cbtTransform& m44T = cylObjWrap->getCollisionObject()->getWorldTransform();
    cbtVector3 diff = m44T.invXform(
        sphereObjWrap->getCollisionObject()
            ->getWorldTransform()
            .getOrigin());  // col0->getWorldTransform().getOrigin()-  col1->getWorldTransform().getOrigin();
    cbtScalar radius0 = sphere0->getRadius();
    cbtScalar radius1 = cylinder->getHalfExtentsWithMargin().getX();  // cylinder->getRadius();
    cbtScalar H1 = cylinder->getHalfExtentsWithMargin().getY();

    cbtVector3 r1 = diff;
    r1.setY(0);

    cbtScalar y1 = diff.y();

    cbtScalar r1_len = r1.length();

    cbtVector3 pos1;
    cbtVector3 normalOnSurfaceB(1, 0, 0);
    cbtScalar dist;

    // Case A
    if ((y1 <= H1) && (y1 >= -H1)) {
        /// iff distance positive, don't generate a new contact
        if (r1_len > (radius0 + radius1)) {
            resultOut->refreshContactPoints();
            return;
        }
        /// distance (negative means penetration)
        dist = r1_len - (radius0 + radius1);

        cbtVector3 localnormalOnSurfaceB;
        if (r1_len > SIMD_EPSILON) {
            localnormalOnSurfaceB = r1 / r1_len;
            normalOnSurfaceB = m44T.getBasis() * localnormalOnSurfaceB;
        }
        /// point on B (worldspace)
        pos1 = m44T(cbtVector3(0, y1, 0)) + radius1 * normalOnSurfaceB;
    } else {
        cbtScalar side = 1;
        if (y1 < -H1)
            side = -1;

        if (r1_len > radius1) {
            // case B
            cbtVector3 pos_loc = r1.normalized() * radius1 + cbtVector3(0, H1 * side, 0);
            pos1 = m44T(pos_loc);
            cbtVector3 d = sphereObjWrap->getCollisionObject()->getWorldTransform().getOrigin() - pos1;
            normalOnSurfaceB = d.normalized();
            dist = d.length() - radius0;
        } else {
            // case C
            normalOnSurfaceB = m44T.getBasis() * cbtVector3(0, 1 * side, 0);
            cbtVector3 pos_loc = r1 + cbtVector3(0, H1 * side, 0);
            pos1 = m44T(pos_loc);
            dist = side * (y1 - H1) - radius0;
        }
    }
    /// report a contact. internally this will be kept persistent, and contact reduction is done
    resultOut->addContactPoint(normalOnSurfaceB, pos1, dist);

    resultOut->refreshContactPoints();
}